

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeprom.c
# Opt level: O2

void write_half_eeprom(int active_dma,gbabus_t *bus,gbamem_t *mem,uint32_t address,uint16_t value)

{
  int iVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  eeprom_size_t size;
  char *__ptr;
  ulong unaff_R12;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  size_t sStack_40;
  
  bVar9 = (byte)value;
  if (mem->eeprom_initialized == false) {
    switch(active_dma) {
    case 0:
      uVar3 = (bus->DMA0CNT_L).raw;
      break;
    case 1:
      uVar3 = (bus->DMA1CNT_L).raw;
      break;
    case 2:
      uVar3 = (bus->DMA2CNT_L).raw;
      break;
    case 3:
      uVar3 = (bus->DMA3CNT_L).raw;
      goto LAB_0011d727;
    default:
      goto switchD_0011d70a_default;
    }
    uVar3 = uVar3 & 0x3fff;
LAB_0011d727:
    size = EEPROM_512;
    if (uVar3 != 9) {
      unaff_R12 = (ulong)uVar3;
      if (uVar3 != 0x11) {
switchD_0011d70a_default:
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/backup/eeprom.c"
                ,0x76);
        fprintf(_stderr,"Write to EEPROM with active DMA %d and a WC of %d\n\x1b[0;m",
                (ulong)(uint)active_dma,unaff_R12 & 0xffffffff);
        goto LAB_0011db4c;
      }
      size = EEPROM_8K;
    }
    init_eeprom(mem,size);
  }
  if (mem->eeprom_state < (EEPROM_ACCEPT_WRITE_ADDRESS|EEPROM_CMD_1)) {
    switch(mem->eeprom_state) {
    case EEPROM_READY:
      mem->eeprom_command = bVar9 * '\x02' & 2;
      mem->eeprom_state = EEPROM_CMD_1;
      break;
    case EEPROM_CMD_1:
      bVar9 = bVar9 & 1 | mem->eeprom_command;
      mem->eeprom_command = bVar9;
      handle_eeprom_command(mem,bVar9);
      return;
    default:
      goto switchD_0011d766_caseD_2;
    case EEPROM_WRITE:
      iVar1 = mem->eeprom_bits_remaining;
      if (iVar1 < 1) {
        if (iVar1 != 0) {
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/backup/eeprom.c"
                  ,0xbd);
          __ptr = "Tried to read from EEPROM when no data was remaining\n\x1b[0;m";
          sStack_40 = 0x3a;
          goto LAB_0011db0a;
        }
        if ((value & 1) != 0) {
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/backup/eeprom.c"
                  ,0xb7);
          fprintf(_stderr,
                  "Expected a write with an LSB of 0 after an EEPROM write stream, instead, got: 0x%04X\n\x1b[0;m"
                  ,value);
          goto LAB_0011db4c;
        }
        mem->eeprom_bits_remaining = 10;
        mem->eeprom_state = EEPROM_POST_WRITE;
        if (gba_log_verbosity != 0) {
          printf("\x1b[0;33m[WARN]  EEPROM write stream completed.\n\x1b[0;m");
        }
      }
      else {
        uVar6 = (long)(0x40 - iVar1) / 8;
        uVar7 = uVar6 & 0xffffffff;
        uVar4 = 7 - (0x40 - iVar1) % 8;
        if (gba_log_verbosity != 0) {
          printf("\x1b[0;33m[WARN]  Transferring %d/64 data bits (byte offset 0x%02X from base address, bit %d)\n\x1b[0;m"
                 ,(ulong)(0x41 - iVar1),uVar7,(ulong)uVar4);
        }
        uVar10 = value & 1;
        uVar6 = (long)(int)uVar6 + (ulong)mem->eeprom_address;
        uVar8 = uVar6 & 0xffffffff;
        if (mem->backup_size < uVar8) {
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/backup/eeprom.c"
                  ,0xae);
          fprintf(_stderr,
                  "Access to EEPROM outside backup space! Index: %d Backup size: %zu\n\x1b[0;m",
                  uVar8,mem->backup_size);
          goto LAB_0011db4c;
        }
        bVar9 = mem->backup[uVar6];
        bVar2 = (byte)(uVar10 << ((byte)uVar4 & 0x1f)) | ~(byte)(1 << ((byte)uVar4 & 0x1f)) & bVar9;
        mem->backup[uVar8] = bVar2;
        mem->backup_dirty = true;
        if (gba_log_verbosity != 0) {
          printf("\x1b[0;33m[WARN]  Wrote bit %d to bit number %d in byte offset: %d. Old value: 0x%02X New value: 0x%02X\n\x1b[0;m"
                 ,(ulong)uVar10,(ulong)uVar4,uVar7,(ulong)bVar9,(ulong)bVar2);
        }
      }
      mem->eeprom_bits_remaining = mem->eeprom_bits_remaining + -1;
      break;
    case EEPROM_ACCEPT_READ_ADDRESS:
      if (mem->eeprom_bits_remaining < 1) {
        if ((gba_log_verbosity != 0 & bVar9) == 1) {
          printf("\x1b[0;33m[WARN]  Expected a value with an LSB of 0 here, got %d (0x%04X)\n\x1b[0;m"
                 ,1,value);
        }
        uVar4 = gba_log_verbosity;
        uVar3 = mem->eeprom_address << 3;
        mem->eeprom_address = uVar3;
        if (uVar4 != 0) {
          printf("\x1b[0;33m[WARN]  Reading 64 bits from EEPROM starting at address: 0x%04X\n\x1b[0;m"
                 ,(ulong)uVar3);
        }
        mem->eeprom_state = EEPROM_READ;
        mem->eeprom_bits_remaining = 0x44;
      }
      else {
        mem->eeprom_address = (value & 1) + mem->eeprom_address * 2;
        mem->eeprom_bits_remaining = mem->eeprom_bits_remaining + -1;
      }
      break;
    case EEPROM_ACCEPT_WRITE_ADDRESS:
      if (0 < mem->eeprom_bits_remaining) {
        iVar1 = (value & 1) + (uint)mem->eeprom_address * 2;
        mem->eeprom_address = (uint16_t)iVar1;
        iVar5 = mem->eeprom_bits_remaining + -1;
        mem->eeprom_bits_remaining = iVar5;
        if (iVar5 != 0) {
          return;
        }
        uVar4 = iVar1 * 8;
        mem->eeprom_address = (uint16_t)uVar4;
        if (gba_log_verbosity != 0) {
          printf("\x1b[0;33m[WARN]  Writing 64 bits to EEPROM starting at address: 0x%04X\n\x1b[0;m"
                 ,(ulong)(uVar4 & 0xffff));
        }
        mem->eeprom_state = EEPROM_WRITE;
        mem->eeprom_bits_remaining = 0x40;
        return;
      }
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/backup/eeprom.c"
              ,0x9d);
      __ptr = "Trying to accept a write address when one is unexpected!\n\x1b[0;m";
      sStack_40 = 0x3e;
LAB_0011db0a:
      fwrite(__ptr,sStack_40,1,_stderr);
      goto LAB_0011db4c;
    }
    return;
  }
switchD_0011d766_caseD_2:
  fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
          "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/backup/eeprom.c",
          0xc3);
  fprintf(_stderr,"Write half 0x%04X to EEPROM in unknown state: %d at addr 0x%08X\n\x1b[0;m",value,
          (ulong)mem->eeprom_state,(ulong)address);
LAB_0011db4c:
  exit(1);
}

Assistant:

void write_half_eeprom(int active_dma, gbabus_t* bus, gbamem_t* mem, word address, half value) {
    if (!mem->eeprom_initialized) {
        int wc;
        switch (active_dma) {
            case 0:
                wc = bus->DMA0CNT_L.wc;
                break;
            case 1:
                wc = bus->DMA1CNT_L.wc;
                break;
            case 2:
                wc = bus->DMA2CNT_L.wc;
                break;
            case 3:
                wc = bus->DMA3CNT_L.wc;
                break;
        }

        switch (wc) {
            case 9: // 9 bits = 2 for command, 6 for address, 1 to end command
                if (!mem->eeprom_initialized) {
                    init_eeprom(mem, EEPROM_512);
                }
                break;
            case 17: // 17 bits = 2 for command, 14 for address, 1 to end command
                if (!mem->eeprom_initialized) {
                    init_eeprom(mem, EEPROM_8K);
                }
                break;
            default:
                logfatal("Write to EEPROM with active DMA %d and a WC of %d", active_dma, wc)
        }
    }

    switch (mem->eeprom_state) {
        case EEPROM_READY:
            mem->eeprom_command = (value & 1) << 1;
            mem->eeprom_state = EEPROM_CMD_1;
            break;
        case EEPROM_CMD_1:
            mem->eeprom_command |= (value & 1);
            handle_eeprom_command(mem, mem->eeprom_command);
            break;
        case EEPROM_ACCEPT_READ_ADDRESS:
            if (mem->eeprom_bits_remaining > 0) {
                mem->eeprom_address <<= 1;
                mem->eeprom_address |= (value & 1);
                mem->eeprom_bits_remaining--;
            } else {
                if ((value & 1) != 0) {
                    logwarn("Expected a value with an LSB of 0 here, got %d (0x%04X)", value & 1, value)
                }
                mem->eeprom_address <<= 3; // Addresses are in 8 bit blocks
                logwarn("Reading 64 bits from EEPROM starting at address: 0x%04X", mem->eeprom_address)
                mem->eeprom_state = EEPROM_READ;
                mem->eeprom_bits_remaining = 64 + 4; // Plus 4 garbage bits
            }
            break;
        case EEPROM_ACCEPT_WRITE_ADDRESS:
            if (mem->eeprom_bits_remaining > 0) {
                mem->eeprom_address <<= 1;
                mem->eeprom_address |= (value & 1);
                if (--mem->eeprom_bits_remaining == 0) {
                    mem->eeprom_address <<= 3; // Addresses are in 8-byte blocks
                    logwarn("Writing 64 bits to EEPROM starting at address: 0x%04X", mem->eeprom_address)
                    mem->eeprom_state = EEPROM_WRITE;
                    mem->eeprom_bits_remaining = 64;
                }
            } else {
                logfatal("Trying to accept a write address when one is unexpected!")
            }
            break;
        case EEPROM_WRITE: {
            int bit = 64 - mem->eeprom_bits_remaining;
            if (mem->eeprom_bits_remaining > 0) {
                int byte_offset = bit / 8;
                int bit_in_byte = 7 - (bit % 8); // MSB first
                byte mask = ~(1 << bit_in_byte);
                logwarn("Transferring %d/64 data bits (byte offset 0x%02X from base address, bit %d)", bit + 1,
                        byte_offset, bit_in_byte)
                byte eeprom_value = mem->backup[mem->eeprom_address + byte_offset];
                byte old_value = eeprom_value;
                eeprom_value &= mask;
                eeprom_value |= ((value & 1) << bit_in_byte);
                word index = mem->eeprom_address + byte_offset;
                if (index > mem->backup_size) {
                    logfatal("Access to EEPROM outside backup space! Index: %d Backup size: %zu", index, mem->backup_size)
                }
                mem->backup[index] = eeprom_value;
                mem->backup_dirty = true;
                logwarn("Wrote bit %d to bit number %d in byte offset: %d. Old value: 0x%02X New value: 0x%02X",
                        value & 1, bit_in_byte, byte_offset, old_value, eeprom_value);
            } else if (mem->eeprom_bits_remaining == 0) {
                if ((value & 1) != 0) {
                    logfatal("Expected a write with an LSB of 0 after an EEPROM write stream, instead, got: 0x%04X",
                             value)
                }
                mem->eeprom_bits_remaining = EEPROM_READS_UNTIL_READY;
                mem->eeprom_state = EEPROM_POST_WRITE; // Entire stream has been written
                logwarn("EEPROM write stream completed.")
            } else {
                logfatal("Tried to read from EEPROM when no data was remaining")
            }
            mem->eeprom_bits_remaining--;
            break;
        }
        default:
            logfatal("Write half 0x%04X to EEPROM in unknown state: %d at addr 0x%08X", value, mem->eeprom_state, address)
    }
}